

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O1

QPointF __thiscall QGestureEvent::mapToGraphicsScene(QGestureEvent *this,QPointF *gesturePoint)

{
  uint uVar1;
  QWidget *this_00;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  QPointF QVar6;
  QPoint local_28;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)QMetaObject::cast((QObject *)&QGraphicsView::staticMetaObject);
  if (this_00 == (QWidget *)0x0) {
    QVar6 = (QPointF)ZEXT816(0);
  }
  else {
    auVar4._0_8_ = (double)((ulong)gesturePoint->xp & 0x8000000000000000 | 0x3fe0000000000000) +
                   gesturePoint->xp;
    auVar4._8_8_ = (double)((ulong)gesturePoint->yp & 0x8000000000000000 | 0x3fe0000000000000) +
                   gesturePoint->yp;
    auVar4 = minpd(_DAT_0066f5d0,auVar4);
    auVar5._8_8_ = -(ulong)(-2147483648.0 < auVar4._8_8_);
    auVar5._0_8_ = -(ulong)(-2147483648.0 < auVar4._0_8_);
    uVar1 = movmskpd((int)this_00,auVar5);
    uVar3 = 0x8000000000000000;
    if ((uVar1 & 2) != 0) {
      uVar3 = (ulong)(uint)(int)auVar4._8_8_ << 0x20;
    }
    uVar2 = 0x80000000;
    if ((uVar1 & 1) != 0) {
      uVar2 = (ulong)(uint)(int)auVar4._0_8_;
    }
    local_28 = (QPoint)(uVar2 | uVar3);
    local_20 = QWidget::mapFromGlobal(this_00,&local_28);
    QVar6 = QGraphicsView::mapToScene((QGraphicsView *)this_00,&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGestureEvent::mapToGraphicsScene(const QPointF &gesturePoint) const
{
    QWidget *w = widget();
    if (w) // we get the viewport as widget, not the graphics view
        w = w->parentWidget();
    QGraphicsView *view = qobject_cast<QGraphicsView*>(w);
    if (view) {
        return view->mapToScene(view->mapFromGlobal(gesturePoint.toPoint()));
    }
    return QPointF();
}